

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O3

bool __thiscall cfd::core::Privkey::IsValid(Privkey *this)

{
  int iVar1;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  ByteData::GetBytes(&local_20,&this->data_);
  if (local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    bVar2 = false;
  }
  else {
    iVar1 = wally_ec_private_key_verify();
    bVar2 = iVar1 == 0;
  }
  if (local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool Privkey::IsValid() const { return IsValid(data_.GetBytes()); }